

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getTemperature(Thermo *this)

{
  Snapshot *this_00;
  int iVar1;
  RealType RVar2;
  RealType RVar3;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasTemperature == false) {
    RVar2 = getTranslationalKinetic(this);
    RVar3 = getRotationalKinetic(this);
    iVar1 = SimInfo::getNdf(this->info_);
    if (iVar1 < 1) {
      RVar2 = 0.0;
    }
    else {
      iVar1 = SimInfo::getNdf(this->info_);
      RVar2 = (RVar2 + RVar3 + RVar2 + RVar3) / ((double)iVar1 * 0.0019872156);
    }
    Snapshot::setTemperature(this_00,RVar2);
  }
  RVar2 = Snapshot::getTemperature(this_00);
  return RVar2;
}

Assistant:

RealType Thermo::getTemperature() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTemperature) {
      RealType nuclearKE =
          this->getTranslationalKinetic() + this->getRotationalKinetic();

      RealType temperature {};

      // With no degrees of freedom, T is not well defined, but we'll
      // set to zero.

      if (info_->getNdf() > 0)
        temperature = (2.0 * nuclearKE) / (info_->getNdf() * Constants::kb);
      else
        temperature = 0.0;

      snap->setTemperature(temperature);
    }

    return snap->getTemperature();
  }